

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O2

type dlib::
     directory_helper_get_dirs<dlib::queue_kernel_2<dlib::directory,20ul,dlib::memory_manager_stateless_kernel_1<char>>>
               (data *state,
               queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
               *dirs)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  DIR *__dirp;
  int *piVar5;
  dirent *pdVar6;
  listing_error *plVar7;
  string *__rhs;
  string path;
  directory temp;
  string dtemp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  stat64 buffer;
  
  queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::clear(dirs)
  ;
  if ((state->full_name)._M_string_length == 0) {
    plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&buffer,"This directory object currently doesn\'t represent any directory."
               ,(allocator *)&temp);
    directory::listing_error::listing_error(plVar7,(string *)&buffer);
    __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
  }
  __rhs = &state->full_name;
  std::__cxx11::string::string((string *)&path,(string *)__rhs);
  cVar1 = path._M_dataplus._M_p[path._M_string_length - 1];
  cVar2 = directory::get_separator();
  if (cVar1 != cVar2) {
    directory::get_separator();
    std::__cxx11::string::push_back((char)&path);
  }
  __dirp = opendir((__rhs->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                   "Unable to list the contents of ",__rhs);
    directory::listing_error::listing_error(plVar7,(string *)&temp);
    __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
  }
  piVar5 = __errno_location();
  while( true ) {
    *piVar5 = 0;
    pdVar6 = readdir(__dirp);
    if (pdVar6 == (dirent *)0x0) break;
    std::operator+(&temp.state.name,&path,pdVar6->d_name);
    iVar4 = stat64(temp.state.name._M_dataplus._M_p,(stat64 *)&buffer);
    std::__cxx11::string::~string((string *)&temp.state);
    if (iVar4 == 0) {
      std::__cxx11::string::string((string *)&dtemp,pdVar6->d_name,(allocator *)&temp.state);
      if ((buffer.st_mode & 0xf000) == 0x4000) {
        bVar3 = std::operator!=(&dtemp,".");
        if (bVar3) {
          bVar3 = std::operator!=(&dtemp,"..");
          if (bVar3) {
            std::operator+(&local_e0,&path,&dtemp);
            directory::directory((directory *)&temp.state,&dtemp,&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::
            enqueue(dirs,(directory *)&temp.state);
            directory::data::~data(&temp.state);
          }
        }
      }
      std::__cxx11::string::~string((string *)&dtemp);
    }
  }
  if (*piVar5 != 0) {
    plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                   "Unable to list the contents of ",__rhs);
    directory::listing_error::listing_error(plVar7,(string *)&temp);
    __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
  }
  do {
    iVar4 = closedir(__dirp);
    if (iVar4 == 0) break;
  } while (*piVar5 == 4);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

typename disable_if<is_std_vector<queue_of_dirs>,void>::type 
    directory_helper_get_dirs (
        const directory::data& state,
        queue_of_dirs& dirs
    ) 
    {
        using namespace std;

        dirs.clear();
        if (state.full_name.size() == 0)
            throw directory::listing_error("This directory object currently doesn't represent any directory.");

        DIR* ffind = 0;
        struct dirent* data;
        struct stat64 buffer;

        try
        {
            string path = state.full_name;
            // ensure that the path ends with a separator
            if (path[path.size()-1] != directory::get_separator())
                path += directory::get_separator();

            // get a handle to something we can search with
            ffind = opendir(state.full_name.c_str());
            if (ffind == 0)
            {
                throw directory::listing_error("Unable to list the contents of " + state.full_name);
            }

            while(true)
            {
                errno = 0;
                if ( (data = readdir(ffind)) == 0)
                {                    
                    // there was an error or no more files
                    if ( errno == 0)
                    {
                        // there are no more files
                        break;
                    }
                    else
                    {
                        // there was an error
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    }                
                }

                // get a stat64 structure so we can see if this is a file
                if (::stat64((path+data->d_name).c_str(), &buffer) != 0)
                {
                    // just assume this isn't a directory.  It is probably a broken
                    // symbolic link.
                    continue;
                }

                string dtemp(data->d_name);
                if (S_ISDIR(buffer.st_mode) &&
                    dtemp != "." &&
                    dtemp != ".." )
                {
                    // this is a directory so add it to dirs
                    directory temp(dtemp,path+dtemp, directory::private_constructor());
                    dirs.enqueue(temp);
                }
            } // while (true)

            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }

        }
        catch (...)
        {
            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }
            dirs.clear();
            throw;
        }
    }